

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t
bsc_alltoall_single(bsc_step_t depends,bsc_group_t group,void *src,void *dst,bsc_size_t size)

{
  uint uVar1;
  int iVar2;
  bsp_pid_t bVar3;
  request_t *prVar4;
  bsp_pid_t bVar5;
  ulong uVar6;
  
  if (group == (bsc_group_t)0x0) {
    uVar1 = bsp_nprocs();
  }
  else {
    uVar1 = *group;
  }
  if (0 < (int)uVar1) {
    uVar6 = 0;
    do {
      if (group == (bsc_group_t)0x0) {
        bVar5 = (bsp_pid_t)uVar6;
        iVar2 = bsp_pid();
      }
      else {
        bVar5 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + uVar6 * 4);
        iVar2 = *(int *)(*(long *)((long)group + 0x18) + uVar6 * 4);
      }
      bVar3 = bsp_pid();
      prVar4 = new_request(depends);
      prVar4->kind = PUT;
      (prVar4->payload).put.src_addr = src;
      (prVar4->payload).put.dst_addr = dst;
      (prVar4->payload).put.src_pid = bVar3;
      (prVar4->payload).put.dst_pid = bVar5;
      (prVar4->payload).put.size = size;
      (prVar4->payload).put.offset = iVar2 * size;
      uVar6 = uVar6 + 1;
      src = (void *)((long)src + (long)size);
    } while (uVar1 != uVar6);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_alltoall_single( bsc_step_t depends, bsc_group_t group,
                      const void * src, void * dst, bsc_size_t size )
{
    const group_t * g = group;
    bsp_pid_t i, P = g?g->size:bsp_nprocs() ;
    const char * src_bytes = (const char *) src;
    for ( i = 0; i < P; ++i ) {
        bsc_pid_t m = g?g->gid[i]:i;
        bsc_size_t doff = g?g->rof[i]:bsp_pid();
        bsc_put( depends, m, src_bytes + i * size, dst, doff * size, size );
    }
    return depends + 1;
}